

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O2

void __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<false>_>::assign_operators
          (fm_engine_base<ymfm::opn_registers_base<false>_> *this)

{
  uint uVar1;
  uint uVar2;
  _Head_base<0UL,_ymfm::fm_operator<ymfm::opn_registers_base<false>_>_*,_false> op;
  byte bVar3;
  uint32_t index;
  uint32_t index_00;
  uint32_t chnum;
  long lVar4;
  operator_mapping map;
  operator_mapping local_3c;
  
  opn_registers_base<false>::operator_map((opn_registers_base<false> *)this,&local_3c);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    uVar1 = local_3c.chan[lVar4];
    bVar3 = 0;
    for (index_00 = 0; index_00 != 4; index_00 = index_00 + 1) {
      uVar2 = uVar1 >> (bVar3 & 0x1f) & 0xff;
      if (uVar2 == 0xff) {
        op._M_head_impl = (fm_operator<ymfm::opn_registers_base<false>_> *)0x0;
      }
      else {
        op._M_head_impl =
             this->m_operator[uVar2]._M_t.
             super___uniq_ptr_impl<ymfm::fm_operator<ymfm::opn_registers_base<false>_>,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<false>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ymfm::fm_operator<ymfm::opn_registers_base<false>_>_*,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<false>_>_>_>
             .super__Head_base<0UL,_ymfm::fm_operator<ymfm::opn_registers_base<false>_>_*,_false>.
             _M_head_impl;
      }
      fm_channel<ymfm::opn_registers_base<false>_>::assign
                ((fm_channel<ymfm::opn_registers_base<false>_> *)
                 this->m_channel[lVar4]._M_t.
                 super___uniq_ptr_impl<ymfm::fm_channel<ymfm::opn_registers_base<false>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<false>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<false>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<false>_>_>_>
                 .super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<false>_>_*,_false>
                 ,index_00,op._M_head_impl);
      bVar3 = bVar3 + 8;
    }
  }
  return;
}

Assistant:

void fm_engine_base<RegisterType>::assign_operators()
{
	typename RegisterType::operator_mapping map;
	m_regs.operator_map(map);

	for (uint32_t chnum = 0; chnum < CHANNELS; chnum++)
		for (uint32_t index = 0; index < 4; index++)
		{
			uint32_t opnum = bitfield(map.chan[chnum], 8 * index, 8);
			m_channel[chnum]->assign(index, (opnum == 0xff) ? nullptr : m_operator[opnum].get());
		}
}